

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

TableIterable<kj::TreeMap<kj::String,_int>::Entry,_decltype(inner)> * __thiscall
kj::Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
::range<0ul,char_const(&)[4],char_const(&)[4]>
          (TableIterable<kj::TreeMap<kj::String,_int>::Entry,_decltype(inner)>
           *__return_storage_ptr__,
          Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
          *this,char (*begin) [4],char (*end) [4])

{
  IterRange<kj::_::BTreeImpl::Iterator> inner_00;
  Iterator b;
  Iterator e;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *pHVar1;
  char (*pacVar2) [4];
  IterRange<kj::_::BTreeImpl::Iterator> *__src;
  undefined8 in_stack_fffffffffffffef8;
  StringPtr *local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> local_a0;
  Iterator local_90;
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> local_78;
  Iterator local_68;
  undefined1 local_50 [8];
  IterRange<kj::_::BTreeImpl::Iterator> inner;
  char (*end_local) [4];
  char (*begin_local) [4];
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  inner.e._16_8_ = end;
  pHVar1 = get<0ul,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>&>
                     ((HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)(this + 0x20));
  local_78 = Vector<kj::TreeMap<kj::String,_int>::Entry>::asPtr
                       ((Vector<kj::TreeMap<kj::String,_int>::Entry> *)this);
  pacVar2 = ::const(begin);
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
  seek<kj::TreeMap<kj::String,int>::Entry,char_const(&)[4]>
            (&local_68,(TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *)pHVar1,local_78,pacVar2)
  ;
  pHVar1 = get<0ul,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>&>
                     ((HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)(this + 0x20));
  local_a0 = Vector<kj::TreeMap<kj::String,_int>::Entry>::asPtr
                       ((Vector<kj::TreeMap<kj::String,_int>::Entry> *)this);
  pacVar2 = ::const((char (*) [4])inner.e._16_8_);
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
  seek<kj::TreeMap<kj::String,int>::Entry,char_const(&)[4]>
            (&local_90,(TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *)pHVar1,local_a0,pacVar2)
  ;
  b.leaf = (Leaf *)local_68._16_8_;
  b.tree = (NodeUnion *)local_68.leaf;
  b._16_8_ = local_90.tree;
  e.leaf = (Leaf *)local_90._16_8_;
  e.tree = (NodeUnion *)local_90.leaf;
  e._16_8_ = in_stack_fffffffffffffef8;
  kj::_::iterRange<kj::_::BTreeImpl::Iterator>(b,e);
  __src = mv<kj::_::IterRange<kj::_::BTreeImpl::Iterator>>
                    ((IterRange<kj::_::BTreeImpl::Iterator> *)local_50);
  memcpy(&local_d0,__src,0x30);
  local_d8 = Vector<kj::TreeMap<kj::String,_int>::Entry>::begin
                       ((Vector<kj::TreeMap<kj::String,_int>::Entry> *)this);
  inner_00.b.leaf = (Leaf *)uStack_c8;
  inner_00.b.tree = (NodeUnion *)local_d0;
  inner_00.b._16_8_ = local_c0;
  inner_00.e.tree = (NodeUnion *)uStack_b8;
  inner_00.e.leaf = (Leaf *)local_b0;
  inner_00.e._16_8_ = uStack_a8;
  MappedIterable<kj::_::IterRange<kj::_::BTreeImpl::Iterator>,kj::_::TableMapping<kj::TreeMap<kj::String,int>::Entry>>
  ::MappedIterable<kj::TreeMap<kj::String,int>::Entry*>
            ((MappedIterable<kj::_::IterRange<kj::_::BTreeImpl::Iterator>,kj::_::TableMapping<kj::TreeMap<kj::String,int>::Entry>>
              *)__return_storage_ptr__,inner_00,&local_d8);
  return __return_storage_ptr__;
}

Assistant:

auto Table<Row, Indexes...>::range(BeginKey&& begin, EndKey&& end) {
  auto inner = _::iterRange(get<index>(indexes).seek(rows.asPtr(), kj::fwd<BeginKey>(begin)),
                            get<index>(indexes).seek(rows.asPtr(), kj::fwd<EndKey>(end)));
  return _::TableIterable<Row, decltype(inner)>(kj::mv(inner), rows.begin());
}